

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(HttpInputStreamImpl *this)

{
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->onMessageDone).ptr);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&this->messageReadQueue);
  HttpHeaders::~HttpHeaders(&this->headers);
  Array<char>::~Array(&this->headerBuffer);
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }